

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdgeSharpness __thiscall
ON_SubD_ComponentIdTypeAndTag::EdgeSharpness
          (ON_SubD_ComponentIdTypeAndTag *this,bool bUseCreaseSharpness)

{
  ON_SubDEdgeTag OVar1;
  
  OVar1 = EdgeTag(this);
  if ((OVar1 != Smooth) && (OVar1 != SmoothX)) {
    if ((OVar1 == Crease) && (bUseCreaseSharpness)) {
      this = (ON_SubD_ComponentIdTypeAndTag *)&ON_SubDEdgeSharpness::Crease;
    }
    else {
      this = (ON_SubD_ComponentIdTypeAndTag *)&ON_SubDEdgeSharpness::Nan;
    }
  }
  return (ON_SubDEdgeSharpness)*&(this->m_sharpness).m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubD_ComponentIdTypeAndTag::EdgeSharpness(bool bUseCreaseSharpness) const
{
  switch (EdgeTag())
  {
  case ON_SubDEdgeTag::Smooth:
  case ON_SubDEdgeTag::SmoothX:
    return m_sharpness;
    break;
  case ON_SubDEdgeTag::Crease:
    if (bUseCreaseSharpness)
      return ON_SubDEdgeSharpness::Crease;
    break;
  default:
    break;
  }
  return ON_SubDEdgeSharpness::Nan;
}